

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::attach_pipe(session_base_t *this,pipe_t *pipe_)

{
  bool bVar1;
  pipe_t *in_RSI;
  own_t *in_RDI;
  
  bVar1 = own_t::is_terminating(in_RDI);
  if (bVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!is_terminating ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0xa4);
    fflush(_stderr);
    zmq_abort((char *)0x3028b1);
  }
  if (in_RDI[1].options.affinity != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_pipe",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0xa5);
    fflush(_stderr);
    zmq_abort((char *)0x302915);
  }
  if (in_RSI == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0xa6);
    fflush(_stderr);
    zmq_abort((char *)0x302971);
  }
  in_RDI[1].options.affinity = (uint64_t)in_RSI;
  pipe_t::set_event_sink(in_RSI,(i_pipe_events *)in_RDI);
  return;
}

Assistant:

void zmq::session_base_t::attach_pipe (pipe_t *pipe_)
{
    zmq_assert (!is_terminating ());
    zmq_assert (!_pipe);
    zmq_assert (pipe_);
    _pipe = pipe_;
    _pipe->set_event_sink (this);
}